

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::AppendTargetOutputs
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,cmNinjaDeps *outputs,
          string *config,cmNinjaTargetDepends depends)

{
  bool bVar1;
  TargetType TVar2;
  cmLocalGenerator *this_00;
  string *psVar3;
  cmAlphaNum *this_01;
  string output;
  string path;
  cmAlphaNum local_b0;
  undefined1 local_80 [40];
  char *local_58;
  char local_50 [32];
  
  bVar1 = cmGeneratorTarget::IsFrameworkOnApple(target);
  TVar2 = cmGeneratorTarget::GetType(target);
  switch(TVar2) {
  case EXECUTABLE:
switchD_0033b00e_caseD_0:
    cmGeneratorTarget::GetFullPath((string *)&local_b0,target,config,RuntimeBinaryArtifact,bVar1);
    psVar3 = ConvertToNinjaPath(this,(string *)&local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(outputs,psVar3);
    break;
  case STATIC_LIBRARY:
  case SHARED_LIBRARY:
  case MODULE_LIBRARY:
    if (depends != DependOnTargetOrdering) goto switchD_0033b00e_caseD_0;
    (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x45])
              (&local_b0,this,target,config);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)outputs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
    break;
  case OBJECT_LIBRARY:
    if (depends == DependOnTargetOrdering) {
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x45])
                (&local_b0,this,target,config);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)outputs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
      break;
    }
  case UTILITY:
  case GLOBAL_TARGET:
  case INTERFACE_LIBRARY:
    this_00 = cmGeneratorTarget::GetLocalGenerator(target);
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    local_b0.View_._M_str = (psVar3->_M_dataplus)._M_p;
    local_b0.View_._M_len = psVar3->_M_string_length;
    local_58 = local_50;
    local_80[0x20] = '\x01';
    local_80[0x21] = '\0';
    local_80[0x22] = '\0';
    local_80[0x23] = '\0';
    local_80[0x24] = '\0';
    local_80[0x25] = '\0';
    local_80[0x26] = '\0';
    local_80[0x27] = '\0';
    local_50[0] = '/';
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    cmStrCat<std::__cxx11::string>
              ((string *)local_80,&local_b0,(cmAlphaNum *)(local_80 + 0x20),psVar3);
    psVar3 = ConvertToNinjaPath(this,(string *)local_80);
    std::__cxx11::string::string((string *)&local_b0,(string *)psVar3);
    bVar1 = cmTarget::IsPerConfig(target->Target);
    if (bVar1) {
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x48])
                (local_80 + 0x20,this,&local_b0,config);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)(local_80 + 0x20));
      std::__cxx11::string::~string((string *)(local_80 + 0x20));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(outputs,(value_type *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    this_01 = (cmAlphaNum *)local_80;
    goto LAB_0033b16d;
  default:
    goto switchD_0033b00e_default;
  }
  this_01 = &local_b0;
LAB_0033b16d:
  std::__cxx11::string::~string((string *)this_01);
switchD_0033b00e_default:
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AppendTargetOutputs(
  cmGeneratorTarget const* target, cmNinjaDeps& outputs,
  const std::string& config, cmNinjaTargetDepends depends) const
{
  // for frameworks, we want the real name, not smple name
  // frameworks always appear versioned, and the build.ninja
  // will always attempt to manage symbolic links instead
  // of letting cmOSXBundleGenerator do it.
  bool realname = target->IsFrameworkOnApple();

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY: {
      if (depends == DependOnTargetOrdering) {
        outputs.push_back(this->OrderDependsTargetForTarget(target, config));
        break;
      }
    }
      CM_FALLTHROUGH;
    case cmStateEnums::EXECUTABLE: {
      outputs.push_back(this->ConvertToNinjaPath(target->GetFullPath(
        config, cmStateEnums::RuntimeBinaryArtifact, realname)));
      break;
    }
    case cmStateEnums::OBJECT_LIBRARY: {
      if (depends == DependOnTargetOrdering) {
        outputs.push_back(this->OrderDependsTargetForTarget(target, config));
        break;
      }
    }
      CM_FALLTHROUGH;
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UTILITY: {
      std::string path =
        cmStrCat(target->GetLocalGenerator()->GetCurrentBinaryDirectory(), '/',
                 target->GetName());
      std::string output = this->ConvertToNinjaPath(path);
      if (target->Target->IsPerConfig()) {
        output = this->BuildAlias(output, config);
      }
      outputs.push_back(output);
      break;
    }

    case cmStateEnums::UNKNOWN_LIBRARY:
      break;
  }
}